

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O2

int __thiscall Heuristics::evaluateStateBestFirst(Heuristics *this,Table currentState)

{
  Cell *this_00;
  int iVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int j;
  long lVar6;
  Table *pTVar7;
  int i;
  long lVar8;
  
  pTVar7 = &currentState;
  iVar4 = 0;
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      this_00 = pTVar7->table[0] + lVar6;
      cVar2 = Cell::getNumber(this_00);
      if (cVar2 != ' ') {
        cVar2 = Cell::getNumber(this_00);
        iVar3 = (int)((short)(cVar2 + -0x31) / -3) + (int)lVar8;
        iVar1 = -iVar3;
        if (0 < iVar3) {
          iVar1 = iVar3;
        }
        iVar5 = (int)lVar6 - (int)((short)(cVar2 + -0x31) % 3);
        iVar3 = -iVar5;
        if (0 < iVar5) {
          iVar3 = iVar5;
        }
        iVar4 = iVar3 + iVar4 + iVar1;
      }
    }
    pTVar7 = (Table *)(pTVar7->table + 1);
  }
  return iVar4;
}

Assistant:

int Heuristics::evaluateStateBestFirst(Table currentState) {
    int distance = 0;
    int number = 0;
    for(int i = 0; i < HEIGHT; i++) {
        for (int j = 0; j < WIDTH; j++) {
            if (currentState.table[i][j].getNumber()  != ' ') {
                number = currentState.table[i][j].getNumber() - '0';
                distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
            }
        }
    }
    return distance;
}